

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O0

int fmt::getpagesize(void)

{
  undefined8 uVar1;
  int unaff_retaddr;
  SystemError *in_stack_00000008;
  CStringRef in_stack_00000010;
  long size;
  BasicCStringRef<char> local_10;
  long local_8;
  
  local_8 = sysconf(0x1e);
  if (local_8 < 0) {
    uVar1 = __cxa_allocate_exception(0x18);
    __errno_location();
    BasicCStringRef<char>::BasicCStringRef(&local_10,"cannot get memory page size");
    SystemError::SystemError(in_stack_00000008,unaff_retaddr,in_stack_00000010);
    __cxa_throw(uVar1,&SystemError::typeinfo,SystemError::~SystemError);
  }
  return (int)local_8;
}

Assistant:

long fmt::getpagesize() {
#ifdef _WIN32
  SYSTEM_INFO si;
  GetSystemInfo(&si);
  return si.dwPageSize;
#else
  long size = FMT_POSIX_CALL(sysconf(_SC_PAGESIZE));
  if (size < 0)
    FMT_THROW(SystemError(errno, "cannot get memory page size"));
  return size;
#endif
}